

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf-test.cpp
# Opt level: O2

void UTF_fgets_test(char *fname)

{
  int iVar1;
  FILE *__stream;
  char16_t *pcVar2;
  size_t sVar3;
  UTF_UC16 *pUVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  UTF_UC16 buf [64];
  UTF_C8 buf2 [128];
  
  __stream = fopen(fname,"rb");
  if (__stream == (FILE *)0x0) {
    UTF_test(0x5a,false);
    return;
  }
  pcVar2 = UTF_fgets<char16_t>(buf,0x40,(FILE *)__stream);
  UTF_test(0x5e,pcVar2 == buf);
  iVar1 = UTF_uj16_cmp(buf,L"TEST\n");
  UTF_test(0x5f,iVar1 == 0);
  sVar3 = UTF_uj16_len(buf);
  UTF_uj16_to_uj8(buf,sVar3 + 1,(UTF_UC8 *)buf2,0x80);
  iVar1 = UTF_j8_cmp(buf2,"TEST\n");
  UTF_test(0x61,iVar1 == 0);
  pcVar2 = UTF_fgets<char16_t>(buf,0x40,(FILE *)__stream);
  UTF_test(99,pcVar2 == buf);
  iVar1 = UTF_uj16_cmp(buf,L"ABC123\n");
  UTF_test(100,iVar1 == 0);
  sVar3 = UTF_uj16_len(buf);
  UTF_uj16_to_uj8(buf,sVar3 + 1,(UTF_UC8 *)buf2,0x80);
  iVar1 = UTF_j8_cmp(buf2,"ABC123\n");
  UTF_test(0x66,iVar1 == 0);
  iVar1 = feof(__stream);
  if (iVar1 == 0) {
    sVar5 = fread(buf,2,0x40,__stream);
    if (sVar5 != 0) {
      for (sVar6 = 1; sVar7 = sVar5, sVar6 - sVar5 != 1; sVar6 = sVar6 + 1) {
        if (buf[sVar6 - 1] == L'\n') {
          if ((sVar6 == 1) || (buf[sVar6 - 2] != L'\r')) {
            if (sVar6 == 0x40) {
              sVar6 = sVar6 - 1;
            }
            buf[sVar6] = L'\0';
            sVar7 = sVar6;
          }
          else {
            (buf + (sVar6 - 2))[0] = L'\n';
            (buf + (sVar6 - 2))[1] = L'\0';
            sVar7 = sVar6;
          }
          break;
        }
      }
      if (sVar7 == 0x40) {
        buf[0x3f] = L'\0';
        sVar7 = 0x3f;
LAB_0010207c:
        if (sVar7 - sVar5 != 0) {
          iVar1 = fseek(__stream,(sVar7 - sVar5) * 2,1);
          if (iVar1 != 0) goto LAB_00101ebc;
        }
      }
      else {
        if (sVar7 != sVar5) goto LAB_0010207c;
        buf[sVar5] = L'\0';
      }
      pUVar4 = (UTF_UC16 *)(undefined1 *)0x0;
      if (buf[0] != L'\0') {
        pUVar4 = buf;
      }
      goto LAB_00101ebe;
    }
  }
LAB_00101ebc:
  pUVar4 = (UTF_UC16 *)(undefined1 *)0x0;
LAB_00101ebe:
  UTF_test(0x68,pUVar4 == buf);
  iVar1 = UTF_uj16_cmp(buf,L"あいうえお\n");
  UTF_test(0x69,iVar1 == 0);
  sVar3 = UTF_uj16_len(buf);
  UTF_uj16_to_uj8(buf,sVar3 + 1,(UTF_UC8 *)buf2,0x80);
  iVar1 = UTF_j8_cmp(buf2,anon_var_dwarf_5a58);
  UTF_test(0x6b,iVar1 == 0);
  pcVar2 = UTF_fgets<char16_t>(buf,0x40,(FILE *)__stream);
  UTF_test(0x6d,pcVar2 == buf);
  iVar1 = UTF_uj16_cmp(buf,L"漢字\n");
  UTF_test(0x6e,iVar1 == 0);
  sVar3 = UTF_uj16_len(buf);
  UTF_uj16_to_uj8(buf,sVar3 + 1,(UTF_UC8 *)buf2,0x80);
  iVar1 = UTF_j8_cmp(buf2,anon_var_dwarf_5a84);
  UTF_test(0x70,iVar1 == 0);
  pcVar2 = UTF_fgets<char16_t>(buf,0x40,(FILE *)__stream);
  UTF_test(0x72,pcVar2 == (char16_t *)0x0);
  fclose(__stream);
  return;
}

Assistant:

void UTF_fgets_test(const char *fname)
{
    FILE *fp;
    UTF_UC16 buf[64];
    UTF_C8 buf2[128];

    fp = fopen(fname, "rb");
    if (!fp)
    {
        UTF_test(__LINE__, fp != NULL);
        return;
    }

    UTF_test(__LINE__, UTF_fgets(buf, 64, fp) == buf);
    UTF_test(__LINE__, UTF_uj16_cmp(buf, UTF_u("TEST\n")) == 0);
    UTF_uj16_to_j8(buf, UTF_uj16_len(buf) + 1, buf2, 128);
    UTF_test(__LINE__, UTF_j8_cmp(buf2, UTF_u8("TEST\n")) == 0);

    UTF_test(__LINE__, UTF_fgets(buf, 64, fp) == buf);
    UTF_test(__LINE__, UTF_uj16_cmp(buf, UTF_u("ABC123\n")) == 0);
    UTF_uj16_to_j8(buf, UTF_uj16_len(buf) + 1, buf2, 128);
    UTF_test(__LINE__, UTF_j8_cmp(buf2, UTF_u8("ABC123\n")) == 0);

    UTF_test(__LINE__, UTF16_fgets(buf, 64, fp) == buf);
    UTF_test(__LINE__, UTF_uj16_cmp(buf, UTF_u("\u3042\u3044\u3046\u3048\u304A\n")) == 0);
    UTF_uj16_to_j8(buf, UTF_uj16_len(buf) + 1, buf2, 128);
    UTF_test(__LINE__, UTF_j8_cmp(buf2, "\xE3\x81\x82\xE3\x81\x84\xE3\x81\x86\xE3\x81\x88\xE3\x81\x8A\n") == 0);

    UTF_test(__LINE__, UTF_fgets(buf, 64, fp) == buf);
    UTF_test(__LINE__, UTF_uj16_cmp(buf, UTF_u("\u6F22\u5B57\n")) == 0);
    UTF_uj16_to_j8(buf, UTF_uj16_len(buf) + 1, buf2, 128);
    UTF_test(__LINE__, UTF_j8_cmp(buf2, "\xE6\xBC\xA2\xE5\xAD\x97\n") == 0);

    UTF_test(__LINE__, UTF_fgets(buf, 64, fp) == NULL);

    fclose(fp);
}